

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_handle.cpp
# Opt level: O2

BufferHandle * __thiscall duckdb::BufferHandle::operator=(BufferHandle *this,BufferHandle *other)

{
  FileBuffer *pFVar1;
  
  pFVar1 = (this->node).ptr;
  (this->node).ptr = (other->node).ptr;
  (other->node).ptr = pFVar1;
  ::std::swap<duckdb::shared_ptr<duckdb::BlockHandle,true>>(&this->handle,&other->handle);
  return this;
}

Assistant:

BufferHandle &BufferHandle::operator=(BufferHandle &&other) noexcept {
	std::swap(node, other.node);
	std::swap(handle, other.handle);
	return *this;
}